

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,Amount *target_value,vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          Amount *select_value,Amount *utxo_fee_value,bool *searched_bnb)

{
  pointer pUVar1;
  int iVar2;
  CfdException *pCVar3;
  bool bVar4;
  Utxo *utxo;
  uint8_t *__s1;
  pointer pUVar5;
  bool use_bnb_out;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  int64_t select_satoshi;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> p_utxos;
  Amount utxo_fee_out;
  Amount local_68;
  uint8_t src [33];
  
  pUVar5 = (utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pUVar1 = (utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pUVar5 != pUVar1) {
    bVar4 = true;
    __s1 = pUVar5->asset;
    do {
      if (bVar4) {
        src[0x20] = __s1[0x20];
        src._0_8_ = *(undefined8 *)__s1;
        src._8_8_ = *(undefined8 *)(__s1 + 8);
        src._16_8_ = *(undefined8 *)(__s1 + 0x10);
        src._24_8_ = *(undefined8 *)(__s1 + 0x18);
        bVar4 = false;
      }
      else {
        iVar2 = bcmp(__s1,src,0x21);
        if (iVar2 != 0) {
          work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x5f0a3e;
          work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0x109;
          work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_9e6cdc;
          core::logger::log<>((CfdSourceLocation *)&work_utxos,kCfdLogLevelWarning,
                              "Failed to SelectCoins. Exists multiple assets in utxo list.");
          pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
          work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&work_utxos,
                     "Failed to SelectCoins. Exists multiple assets in utxo list.","");
          core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&work_utxos);
          __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      pUVar5 = (pointer)(__s1 + 0x4f);
      __s1 = __s1 + 0xd8;
    } while (pUVar5 != pUVar1);
  }
  if (select_value != (Amount *)0x0) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector(&work_utxos,utxos);
    p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
              (&p_utxos,((long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed)
    ;
    if (work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)CONCAT44(work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                          _M_impl.super__Vector_impl_data._M_finish._0_4_)) {
      pUVar5 = work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        utxo_fee_out.amount_ = (int64_t)pUVar5;
        if (p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*>
                    ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)&p_utxos,
                     (iterator)
                     p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,(Utxo **)&utxo_fee_out);
        }
        else {
          *p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
           super__Vector_impl_data._M_finish = pUVar5;
          p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pUVar5 = pUVar5 + 1;
      } while (pUVar5 != (pointer)CONCAT44(work_utxos.
                                           super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           work_utxos.
                                           super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_));
    }
    core::Amount::Amount(&utxo_fee_out);
    use_bnb_out = false;
    select_satoshi = 0;
    local_68.amount_ = core::Amount::GetSatoshiValue(target_value);
    SelectCoinsMinConf(__return_storage_ptr__,this,&local_68.amount_,&p_utxos,filter,option_params,
                       tx_fee_value,true,&select_satoshi,&utxo_fee_out,&use_bnb_out);
    if (utxo_fee_value != (Amount *)0x0) {
      utxo_fee_value->ignore_check_ = utxo_fee_out.ignore_check_;
      utxo_fee_value->amount_ = utxo_fee_out.amount_;
    }
    if (searched_bnb != (bool *)0x0) {
      *searched_bnb = use_bnb_out;
    }
    core::Amount::Amount(&local_68,select_satoshi);
    select_value->ignore_check_ = local_68.ignore_check_;
    select_value->amount_ = local_68.amount_;
    if (p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(p_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x5f0a3e;
  work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x112;
  work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_9e6cdc;
  core::logger::log<>((CfdSourceLocation *)&work_utxos,kCfdLogLevelWarning,
                      "Outparameter(select_value) is nullptr.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&work_utxos,"Failed to select coin. Outparameter is nullptr.","");
  core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&work_utxos);
  __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const Amount& target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, Amount* select_value, Amount* utxo_fee_value,
    bool* searched_bnb) {
#ifndef CFD_DISABLE_ELEMENTS
  bool first = true;
  uint8_t src[33];
  for (auto& utxo : utxos) {
    if (first) {
      memcpy(src, utxo.asset, sizeof(src));
      first = false;
    } else if (memcmp(utxo.asset, src, sizeof(src)) != 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Exists multiple assets in utxo list.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Exists multiple assets in utxo list.");
    }
  }
#endif
  if (select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Outparameter(select_value) is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to select coin. Outparameter is nullptr.");
  }

  // convert utxo list
  std::vector<Utxo> work_utxos = utxos;
  std::vector<Utxo*> p_utxos;
  p_utxos.reserve(utxos.size());
  for (auto& utxo : work_utxos) {
    p_utxos.push_back(&utxo);
  }

  // initialize output parameter
  Amount utxo_fee_out = Amount();
  bool use_bnb_out = false;
  const bool consider_fee = true;
  int64_t select_satoshi = 0;
  std::vector<Utxo> result = SelectCoinsMinConf(
      target_value.GetSatoshiValue(), p_utxos, filter, option_params,
      tx_fee_value, consider_fee, &select_satoshi, &utxo_fee_out,
      &use_bnb_out);
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = utxo_fee_out;
  }
  if (searched_bnb != nullptr) {
    *searched_bnb = use_bnb_out;
  }
  *select_value = Amount(select_satoshi);

  return result;
}